

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  allocator<char> local_79;
  string local_78;
  string_view local_58;
  undefined1 local_38 [8];
  string install_always;
  cmExecutionStatus *status_local;
  cmFileInstaller *this_local;
  
  install_always.field_2._8_8_ = status;
  cmFileCopier::cmFileCopier(&this->super_cmFileCopier,status,"INSTALL");
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_015560f0;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xf4 = 4;
  this->InstallMode = COPY;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  std::__cxx11::string::string((string *)&this->Rename);
  std::__cxx11::string::string((string *)&this->Manifest);
  (this->super_cmFileCopier).UseSourcePermissions = false;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS",(string *)local_38);
  if (bVar1) {
    local_58 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    bVar1 = cmIsOn(local_58);
    (this->super_cmFileCopier).Always = bVar1;
  }
  this_00 = (this->super_cmFileCopier).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_INSTALL_MANIFEST_FILES",&local_79);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_78);
  std::__cxx11::string::operator=((string *)&this->Manifest,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

cmFileInstaller::cmFileInstaller(cmExecutionStatus& status)
  : cmFileCopier(status, "INSTALL")
{
  // Installation does not use source permissions by default.
  this->UseSourcePermissions = false;
  // Check whether to copy files always or only if they have changed.
  std::string install_always;
  if (cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS", install_always)) {
    this->Always = cmIsOn(install_always);
  }
  // Get the current manifest.
  this->Manifest =
    this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
}